

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

void __thiscall QUrlQuery::setQueryItems(QUrlQuery *this,QList<std::pair<QString,_QString>_> *query)

{
  bool bVar1;
  QUrlQueryPrivate *value;
  const_iterator o;
  QString *in_RSI;
  QUrlQueryPrivate *in_RDI;
  long in_FS_OFFSET;
  QUrlQueryPrivate *dd;
  const_iterator end;
  const_iterator it;
  QList<std::pair<QString,_QString>_> *in_stack_ffffffffffffffb0;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  clear((QUrlQuery *)in_stack_ffffffffffffffb0);
  bVar1 = QList<std::pair<QString,_QString>_>::isEmpty
                    ((QList<std::pair<QString,_QString>_> *)0x314879);
  if (!bVar1) {
    value = ::QSharedDataPointer::operator_cast_to_QUrlQueryPrivate_
                      ((QSharedDataPointer<QUrlQueryPrivate> *)in_stack_ffffffffffffffb0);
    local_10.i = (pair<QString,_QString> *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<std::pair<QString,_QString>_>::constBegin(in_stack_ffffffffffffffb0);
    o = QList<std::pair<QString,_QString>_>::constEnd(in_stack_ffffffffffffffb0);
    while (bVar1 = QList<std::pair<QString,_QString>_>::const_iterator::operator!=(&local_10,o),
          bVar1) {
      QList<std::pair<QString,_QString>_>::const_iterator::operator->(&local_10);
      QList<std::pair<QString,_QString>_>::const_iterator::operator->(&local_10);
      QUrlQueryPrivate::addQueryItem(in_RDI,in_RSI,(QString *)value);
      QList<std::pair<QString,_QString>_>::const_iterator::operator++(&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUrlQuery::setQueryItems(const QList<std::pair<QString, QString> > &query)
{
    clear();
    if (query.isEmpty())
        return;

    QUrlQueryPrivate *dd = d;
    QList<std::pair<QString, QString> >::const_iterator it = query.constBegin(),
            end = query.constEnd();
    for ( ; it != end; ++it)
        dd->addQueryItem(it->first, it->second);
}